

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.h
# Opt level: O0

void __thiscall LinkList<Statistic>::Delete(LinkList<Statistic> *this,int which)

{
  int local_24;
  InternalNode *pIStack_20;
  int i;
  InternalNode *pnDeleteMe;
  int which_local;
  LinkList<Statistic> *this_local;
  
  if ((which <= this->iLength) && (which != 0)) {
    pIStack_20 = this->pnHead;
    for (local_24 = 1; local_24 < which; local_24 = local_24 + 1) {
      pIStack_20 = pIStack_20->next;
    }
    if (pIStack_20 == this->pnHead) {
      if (pIStack_20->next == (InternalNode *)0x0) {
        if (pIStack_20 != (InternalNode *)0x0) {
          InternalNode::~InternalNode(pIStack_20);
          operator_delete(pIStack_20);
        }
        SetNull(this);
      }
      else {
        this->pnHead = pIStack_20->next;
        this->pnHead->previous = (InternalNode *)0x0;
        if (pIStack_20 != (InternalNode *)0x0) {
          InternalNode::~InternalNode(pIStack_20);
          operator_delete(pIStack_20);
        }
        this->pnLastRef = this->pnHead;
      }
    }
    else if (pIStack_20 == this->pnTail) {
      if (pIStack_20->previous == (InternalNode *)0x0) {
        if (pIStack_20 != (InternalNode *)0x0) {
          InternalNode::~InternalNode(pIStack_20);
          operator_delete(pIStack_20);
        }
        SetNull(this);
      }
      else {
        this->pnTail = pIStack_20->previous;
        this->pnTail->next = (InternalNode *)0x0;
        if (pIStack_20 != (InternalNode *)0x0) {
          InternalNode::~InternalNode(pIStack_20);
          operator_delete(pIStack_20);
        }
        this->pnLastRef = this->pnTail;
      }
    }
    else {
      this->pnLastRef = pIStack_20->next;
      pIStack_20->previous->next = pIStack_20->next;
      pIStack_20->next->previous = pIStack_20->previous;
      if (pIStack_20 != (InternalNode *)0x0) {
        InternalNode::~InternalNode(pIStack_20);
        operator_delete(pIStack_20);
      }
    }
    if (this->iLength != 0) {
      this->iLength = this->iLength + -1;
    }
  }
  return;
}

Assistant:

inline void LinkList<T>::Delete(int which)
{
   if (which>iLength || which == 0)
      return;

   InternalNode *pnDeleteMe = pnHead;

   for (int i=1; i<which; i++)
      pnDeleteMe = pnDeleteMe->next;

   if (pnDeleteMe == pnHead)
   {
      if (pnDeleteMe->next == NULL)
      {
         delete pnDeleteMe;
         SetNull();
      }
      else
      {
         pnHead = pnDeleteMe->next;
         pnHead->previous = NULL;
         delete pnDeleteMe;
         pnLastRef = pnHead;
      }
   }
   else
   {
      if (pnDeleteMe == pnTail)
      {
         if (pnDeleteMe->previous == NULL)
         {
            delete pnDeleteMe;
            SetNull();
         }
         else
         {
            pnTail = pnDeleteMe->previous;
            pnTail->next = NULL;
            delete pnDeleteMe;
            pnLastRef = pnTail;
         }
      }
      else
      {
         pnLastRef = pnDeleteMe->next;
         pnDeleteMe->previous->next = pnDeleteMe->next;
         pnDeleteMe->next->previous = pnDeleteMe->previous;
         delete pnDeleteMe;
      }
   }

   if (iLength!=0)
      --iLength;
}